

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationAddress.h
# Opt level: O2

void __thiscall
DIS::LinearObjectStatePdu::setReceivingID(LinearObjectStatePdu *this,SimulationAddress *pX)

{
  unsigned_short uVar1;
  
  uVar1 = pX->_application;
  (this->_receivingID)._site = pX->_site;
  (this->_receivingID)._application = uVar1;
  return;
}

Assistant:

class OPENDIS6_EXPORT SimulationAddress
{
protected:
  /** The site ID */
  unsigned short _site; 

  /** The application ID */
  unsigned short _application; 


 public:
    SimulationAddress();
    virtual ~SimulationAddress();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned short getSite() const; 
    void setSite(unsigned short pX); 

    unsigned short getApplication() const; 
    void setApplication(unsigned short pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const SimulationAddress& rhs) const;
}